

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_fragment.c
# Opt level: O0

void EmitUncompressedMetaBlock(uint8_t *input,size_t input_size,size_t *storage_ix,uint8_t *storage)

{
  uint8_t *storage_local;
  size_t *storage_ix_local;
  size_t input_size_local;
  uint8_t *input_local;
  
  BrotliStoreMetaBlockHeader(input_size,1,storage_ix,storage);
  *storage_ix = *storage_ix + 7 & 0xfffffff8;
  memcpy(storage + (*storage_ix >> 3),input,input_size);
  *storage_ix = input_size * 8 + *storage_ix;
  storage[*storage_ix >> 3] = '\0';
  return;
}

Assistant:

static void EmitUncompressedMetaBlock(const uint8_t* begin, const uint8_t* end,
                                      const size_t storage_ix_start,
                                      size_t* storage_ix, uint8_t* storage) {
  const size_t len = (size_t)(end - begin);
  RewindBitPosition(storage_ix_start, storage_ix, storage);
  BrotliStoreMetaBlockHeader(len, 1, storage_ix, storage);
  *storage_ix = (*storage_ix + 7u) & ~7u;
  memcpy(&storage[*storage_ix >> 3], begin, len);
  *storage_ix += len << 3;
  storage[*storage_ix >> 3] = 0;
}